

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O3

Vec_Int_t * Mf_ManDeriveCnfs(Mf_Man_t *p,int *pnVars,int *pnClas,int *pnLits)

{
  Vec_Mem_t *pVVar1;
  word uOn;
  Vec_Int_t *pVVar2;
  undefined1 auVar3 [12];
  undefined1 auVar4 [12];
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint *puVar9;
  void *pvVar10;
  Vec_Int_t *p_00;
  int *piVar11;
  undefined8 uVar12;
  Gia_Man_t *pGVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  int iVar19;
  ulong uVar20;
  int iVar21;
  uint uVar22;
  long lVar23;
  Mf_Man_t *pMVar24;
  bool bVar25;
  size_t __size;
  uint uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 in_XMM6 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar47 [16];
  int pCnf [512];
  uint local_89c;
  void *local_898;
  int **local_890;
  uint *local_888;
  void *local_880;
  int local_874;
  int *local_870;
  int *local_868;
  int *local_860;
  Mf_Man_t *local_858;
  ulong local_850;
  int *local_848;
  ulong local_840;
  uint local_838 [514];
  uint uVar46;
  uint uVar48;
  
  uVar26 = (p->vCnfSizes).nSize;
  local_870 = pnLits;
  local_868 = pnClas;
  local_860 = pnVars;
  puVar9 = (uint *)malloc(0x10);
  uVar14 = 0x10;
  if (0xe < uVar26 - 1) {
    uVar14 = uVar26;
  }
  *puVar9 = uVar14;
  local_888 = puVar9;
  if (uVar14 == 0) {
    puVar9[2] = 0;
    puVar9[3] = 0;
    puVar9[1] = uVar26;
  }
  else {
    pvVar10 = malloc((long)(int)uVar14 << 2);
    *(void **)(puVar9 + 2) = pvVar10;
    puVar9[1] = uVar26;
    if (pvVar10 != (void *)0x0) {
      memset(pvVar10,0,(long)(int)uVar26 * 4);
    }
  }
  p_00 = (Vec_Int_t *)malloc(0x10);
  iVar21 = 0x10;
  if (0xe < uVar26 * 3 - 1) {
    iVar21 = uVar26 * 3;
  }
  p_00->nSize = 0;
  p_00->nCap = iVar21;
  if (iVar21 == 0) {
    local_890 = &p_00->pArray;
    p_00->pArray = (int *)0x0;
    if ((int)uVar26 < 1) goto LAB_0077981b;
    __size = (ulong)uVar26 * 4;
LAB_007797e6:
    local_890 = &p_00->pArray;
    piVar11 = (int *)malloc(__size);
LAB_007797ee:
    *local_890 = piVar11;
    if (piVar11 == (int *)0x0) {
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    p_00->nCap = uVar26;
  }
  else {
    piVar11 = (int *)malloc((long)iVar21 << 2);
    local_890 = &p_00->pArray;
    p_00->pArray = piVar11;
    if (iVar21 < (int)uVar26) {
      __size = (long)(int)uVar26 << 2;
      if (piVar11 == (int *)0x0) goto LAB_007797e6;
      piVar11 = (int *)realloc(piVar11,__size);
      goto LAB_007797ee;
    }
  }
  if (0 < (int)uVar26) {
    memset(piVar11,0xff,(ulong)uVar26 * 4);
  }
LAB_0077981b:
  p_00->nSize = uVar26;
  if (8 < p->pPars->nLutSize) {
    __assert_fail("p->pPars->nLutSize <= 8",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                  ,0x114,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
  }
  uVar12 = CONCAT71((int7)((ulong)p->pPars >> 8),1);
  bVar25 = false;
  lVar23 = 0;
  local_858 = p;
  do {
    local_898 = (void *)CONCAT44(local_898._4_4_,(int)uVar12);
    pVVar1 = local_858->vTtMem;
    uVar26 = (uint)lVar23;
    if (local_858->pPars->nLutSize < 7) {
      if (pVVar1->nEntries <= lVar23) goto LAB_00779e44;
      uOn = pVVar1->ppPages[uVar26 >> ((byte)pVVar1->LogPageSze & 0x1f)]
            [(long)(int)(pVVar1->PageMask & uVar26) * (long)pVVar1->nEntrySize];
      local_89c = 0;
      Abc_Tt6IsopCover(uOn,uOn,uVar26,(int *)local_838,(int *)&local_89c);
      if ((long)(int)local_89c < 1) {
        uVar14 = 0;
      }
      else {
        lVar15 = 0;
        do {
          local_838[lVar15] = local_838[lVar15] | 1 << (char)lVar23 * '\x02';
          lVar15 = lVar15 + 1;
          uVar14 = local_89c;
        } while ((int)local_89c != lVar15);
      }
      Abc_Tt6IsopCover(~uOn,~uOn,uVar26,(int *)local_838,(int *)&local_89c);
      uVar20 = (ulong)local_89c;
      if ((int)uVar14 < (int)local_89c) {
        uVar16 = (ulong)uVar14;
        do {
          local_838[uVar16] = local_838[uVar16] | 2 << (char)lVar23 * '\x02';
          uVar16 = uVar16 + 1;
        } while (uVar20 != uVar16);
      }
      if (0x40 < (int)local_89c) goto LAB_00779e63;
    }
    else {
      if (pVVar1->nEntries <= lVar23) goto LAB_00779e44;
      uVar26 = Abc_Tt8Cnf(pVVar1->ppPages[uVar26 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
                          (long)(int)(pVVar1->PageMask & uVar26) * (long)pVVar1->nEntrySize,uVar26,
                          (int *)local_838);
      uVar20 = (ulong)uVar26;
    }
    iVar19 = (int)uVar20;
    iVar21 = iVar19;
    if (0 < iVar19) {
      uVar17 = 0;
      uVar16 = uVar20;
      do {
        if (bVar25) {
          uVar16 = (ulong)(((int)uVar16 + 1) - (uint)((local_838[uVar17] & 3) == 0));
        }
        iVar21 = (int)uVar16;
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    uVar16 = (ulong)(int)local_888[1];
    if ((long)uVar16 <= lVar23) goto LAB_00779e25;
    local_880 = *(void **)(local_888 + 2);
    *(int *)((long)local_880 + lVar23 * 4) = iVar21;
    if (p_00->nSize <= lVar23) goto LAB_00779e25;
    p_00->pArray[lVar23] = p_00->nSize;
    Vec_IntPush(p_00,iVar19);
    if (0 < iVar19) {
      uVar17 = 0;
      do {
        Vec_IntPush(p_00,local_838[uVar17]);
        uVar17 = uVar17 + 1;
      } while (uVar20 != uVar17);
    }
    lVar23 = 1;
    bVar25 = true;
    uVar12 = 0;
  } while (((ulong)local_898 & 1) != 0);
  pGVar13 = local_858->pGia;
  pVVar2 = pGVar13->vCos;
  *local_860 = pGVar13->vCis->nSize + 1 + pVVar2->nSize;
  *local_868 = pVVar2->nSize * 2 + 1;
  *local_870 = pVVar2->nSize * 4 + 1;
  if (0 < pGVar13->nObjs) {
    lVar23 = 0;
    pMVar24 = local_858;
    do {
      if ((~*(uint *)(pGVar13->pObjs + lVar23) & 0x1fffffff) != 0 &&
          -1 < (int)*(uint *)(pGVar13->pObjs + lVar23)) {
        if (0xffff < *(uint *)&pMVar24->pLfObjs[lVar23].field_0xc) {
          uVar26 = pMVar24->pLfObjs[lVar23].iCutSet;
          uVar14 = (int)uVar26 >> 0x10;
          if (((int)uVar14 < 0) || ((pMVar24->vPages).nSize <= (int)uVar14)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                          ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
          }
          pvVar10 = (pMVar24->vPages).pArray[uVar14];
          uVar17 = (ulong)(uVar26 & 0xffff);
          uVar26 = *(uint *)((long)pvVar10 + uVar17 * 4 + 4);
          uVar14 = uVar26 >> 6;
          uVar20 = (ulong)uVar14;
          iVar21 = p_00->nSize;
          if (iVar21 <= (int)uVar14) {
LAB_00779e82:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          piVar11 = *local_890;
          if (piVar11[uVar20] == -1) {
            pVVar1 = pMVar24->vTtMem;
            local_898 = pvVar10;
            local_874 = iVar21;
            local_848 = piVar11;
            local_840 = uVar16;
            if (pMVar24->pPars->nLutSize < 7) {
              if (pVVar1->nEntries <= (int)uVar14) {
LAB_00779e44:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              local_850 = pVVar1->ppPages[uVar14 >> ((byte)pVVar1->LogPageSze & 0x1f)]
                          [(ulong)(pVVar1->PageMask & uVar14) * (long)pVVar1->nEntrySize];
              uVar26 = uVar26 & 0x1f;
              local_89c = 0;
              Abc_Tt6IsopCover(local_850,local_850,uVar26,(int *)local_838,(int *)&local_89c);
              if ((long)(int)local_89c < 1) {
                uVar8 = 0;
              }
              else {
                lVar15 = 0;
                do {
                  local_838[lVar15] = local_838[lVar15] | 1 << ((char)uVar26 * '\x02' & 0x1fU);
                  lVar15 = lVar15 + 1;
                  uVar8 = local_89c;
                } while ((int)local_89c != lVar15);
              }
              Abc_Tt6IsopCover(~local_850,~local_850,uVar26,(int *)local_838,(int *)&local_89c);
              uVar16 = (ulong)local_89c;
              if ((int)uVar8 < (int)local_89c) {
                uVar18 = (ulong)uVar8;
                do {
                  local_838[uVar18] = local_838[uVar18] | 2 << ((char)uVar26 * '\x02' & 0x1fU);
                  uVar18 = uVar18 + 1;
                } while (uVar16 != uVar18);
              }
              pMVar24 = local_858;
              if (0x40 < (int)local_89c) {
LAB_00779e63:
                __assert_fail("nCubes <= 64",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/utilTruth.h"
                              ,0xa07,"int Abc_Tt6Cnf(word, int, int *)");
              }
            }
            else {
              if (pVVar1->nEntries <= (int)uVar14) goto LAB_00779e44;
              uVar26 = Abc_Tt8Cnf(pVVar1->ppPages[uVar14 >> ((byte)pVVar1->LogPageSze & 0x1f)] +
                                  (ulong)(pVVar1->PageMask & uVar14) * (long)pVVar1->nEntrySize,
                                  uVar26 & 0x1f,(int *)local_838);
              uVar16 = (ulong)uVar26;
            }
            if ((pMVar24->vCnfSizes).nSize <= (int)uVar14) goto LAB_00779e82;
            iVar21 = (int)uVar16;
            if (iVar21 != (pMVar24->vCnfSizes).pArray[uVar20]) {
              __assert_fail("nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMf.c"
                            ,0x134,"Vec_Int_t *Mf_ManDeriveCnfs(Mf_Man_t *, int *, int *, int *)");
            }
            iVar19 = iVar21;
            if (0 < iVar21) {
              uVar8 = *(uint *)((long)local_898 + uVar17 * 4 + 4) & 0x1f;
              uVar26 = uVar8 - 1;
              uVar18 = 0;
              uVar17 = uVar16;
              do {
                if (uVar8 != 0) {
                  uVar35 = local_838[uVar18];
                  uVar22 = uVar8 + 3 & 0xfffffffc;
                  uVar46 = 0;
                  uVar48 = 1;
                  uVar6 = 2;
                  uVar7 = 3;
                  uVar28 = (uint)uVar17;
                  uVar30 = 0;
                  uVar32 = 0;
                  uVar34 = 0;
                  do {
                    uVar33 = uVar34;
                    uVar31 = uVar32;
                    uVar29 = uVar30;
                    uVar27 = uVar28;
                    uVar39 = uVar7;
                    uVar38 = uVar6;
                    uVar37 = uVar48;
                    uVar36 = uVar46;
                    auVar43._4_4_ = uVar37 * 2;
                    auVar43._0_4_ = uVar36 * 2;
                    iVar19 = uVar38 * 2;
                    auVar43._8_4_ = iVar19;
                    iVar5 = uVar39 * 2;
                    auVar43._12_4_ = iVar5;
                    auVar42 = pshuflw(in_XMM6,auVar43,0xfe);
                    auVar43 = pshuflw(auVar42,auVar43,0x54);
                    auVar40._4_4_ = iVar5;
                    auVar40._0_4_ = iVar19;
                    auVar40._8_4_ = iVar19;
                    auVar40._12_4_ = iVar5;
                    auVar44 = pshuflw(auVar43,auVar40,0xfe);
                    auVar41._4_4_ = uVar35;
                    auVar41._0_4_ = uVar35;
                    auVar41._8_4_ = uVar35;
                    auVar41._12_4_ = uVar35;
                    uVar48 = (int)uVar35 >> auVar44;
                    auVar3._4_8_ = auVar41._8_8_;
                    auVar3._0_4_ = uVar48;
                    auVar47._0_8_ = auVar3._0_8_ << 0x20;
                    auVar47._8_4_ = uVar48;
                    auVar47._12_4_ = uVar48;
                    auVar41 = pshuflw(auVar40,auVar40,0x54);
                    auVar44._4_4_ = uVar35;
                    auVar44._0_4_ = uVar35;
                    auVar44._8_4_ = uVar35;
                    auVar44._12_4_ = uVar35;
                    uVar46 = (int)uVar35 >> auVar41;
                    auVar4._4_8_ = auVar44._8_8_;
                    auVar4._0_4_ = uVar46;
                    auVar45._0_8_ = auVar4._0_8_ << 0x20;
                    auVar45._8_4_ = uVar46;
                    auVar45._12_4_ = uVar46;
                    in_XMM6._8_8_ = auVar47._8_8_;
                    in_XMM6._0_8_ = auVar45._8_8_;
                    uVar28 = uVar27 + (((int)uVar35 >> auVar43 & 3U) != 0);
                    uVar30 = uVar29 + (((int)uVar35 >> auVar42 & 3U) != 0);
                    uVar32 = uVar31 + ((uVar46 & 3) != 0);
                    uVar34 = uVar33 + ((uVar48 & 3) != 0);
                    uVar22 = uVar22 - 4;
                    uVar46 = uVar36 + 4;
                    uVar48 = uVar37 + 4;
                    uVar6 = uVar38 + 4;
                    uVar7 = uVar39 + 4;
                  } while (uVar22 != 0);
                  uVar35 = -(uint)((int)(uVar26 ^ 0x80000000) < (int)(uVar36 ^ 0x80000000));
                  uVar22 = -(uint)((int)(uVar26 ^ 0x80000000) < (int)(uVar37 ^ 0x80000000));
                  uVar46 = -(uint)((int)(uVar26 ^ 0x80000000) < (int)(uVar38 ^ 0x80000000));
                  uVar48 = -(uint)((int)(uVar26 ^ 0x80000000) < (int)(uVar39 ^ 0x80000000));
                  uVar17 = (ulong)((~uVar48 & uVar34 | uVar33 & uVar48) +
                                   (~uVar22 & uVar30 | uVar29 & uVar22) +
                                  (~uVar46 & uVar32 | uVar31 & uVar46) +
                                  (~uVar35 & uVar28 | uVar27 & uVar35));
                }
                iVar19 = (int)uVar17;
                uVar18 = uVar18 + 1;
              } while (uVar18 != uVar16);
            }
            if ((int)local_840 <= (int)uVar14) {
LAB_00779e25:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
            }
            *(int *)((long)local_880 + (ulong)(uVar14 * 4)) = iVar19;
            *(int *)((long)local_848 + (ulong)(uVar14 * 4)) = local_874;
            Vec_IntPush(p_00,iVar21);
            if (0 < iVar21) {
              uVar17 = 0;
              do {
                Vec_IntPush(p_00,local_838[uVar17]);
                uVar17 = uVar17 + 1;
              } while (uVar16 != uVar17);
            }
          }
          *local_860 = *local_860 + 1;
          if ((pMVar24->vCnfSizes).nSize <= (int)uVar14) goto LAB_00779e82;
          *local_868 = *local_868 + (pMVar24->vCnfSizes).pArray[uVar20];
          uVar16 = (ulong)local_888[1];
          if ((int)local_888[1] <= (int)uVar14) goto LAB_00779e82;
          *local_870 = *local_870 + *(int *)((long)local_880 + uVar20 * 4);
          pGVar13 = pMVar24->pGia;
        }
      }
      lVar23 = lVar23 + 1;
    } while (lVar23 < pGVar13->nObjs);
  }
  if (local_880 != (void *)0x0) {
    free(local_880);
  }
  free(local_888);
  return p_00;
}

Assistant:

Vec_Int_t * Mf_ManDeriveCnfs( Mf_Man_t * p, int * pnVars, int * pnClas, int * pnLits )
{
    int i, k, iFunc, nCubes, nLits, * pCut, pCnf[512];
    Vec_Int_t * vLits = Vec_IntStart( Vec_IntSize(&p->vCnfSizes) );
    Vec_Int_t * vCnfs = Vec_IntAlloc( 3 * Vec_IntSize(&p->vCnfSizes) );
    Vec_IntFill( vCnfs, Vec_IntSize(&p->vCnfSizes), -1 );
    assert( p->pPars->nLutSize <= 8 );
    // constant/buffer
    for ( iFunc = 0; iFunc < 2; iFunc++ )
    {
        if ( p->pPars->nLutSize <= 6 )
            nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        else
            nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), iFunc, pCnf );
        nLits = Mf_ManCountLits( pCnf, nCubes, iFunc );
        Vec_IntWriteEntry( vLits, iFunc, nLits );
        Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
        Vec_IntPush( vCnfs, nCubes );
        for ( k = 0; k < nCubes; k++ )
            Vec_IntPush( vCnfs, pCnf[k] );
    }
    // other functions
    *pnVars = 1 + Gia_ManCiNum(p->pGia) + Gia_ManCoNum(p->pGia);
    *pnClas = 1 + 2 * Gia_ManCoNum(p->pGia);
    *pnLits = 1 + 4 * Gia_ManCoNum(p->pGia);
    Gia_ManForEachAndId( p->pGia, i )
    {
        if ( !Mf_ObjMapRefNum(p, i) )
            continue;
        pCut = Mf_ObjCutBest( p, i );
        //Mf_CutPrintOne( pCut );
        iFunc = Abc_Lit2Var( Mf_CutFunc(pCut) );
        if ( Vec_IntEntry(vCnfs, iFunc) == -1 )
        {
            if ( p->pPars->nLutSize <= 6 )
                nCubes = Abc_Tt6Cnf( *Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            else
                nCubes = Abc_Tt8Cnf( Vec_MemReadEntry(p->vTtMem, iFunc), Mf_CutSize(pCut), pCnf );
            assert( nCubes == Vec_IntEntry(&p->vCnfSizes, iFunc) );
            nLits = Mf_ManCountLits( pCnf, nCubes, Mf_CutSize(pCut) );
            // save CNF
            Vec_IntWriteEntry( vLits, iFunc, nLits );
            Vec_IntWriteEntry( vCnfs, iFunc, Vec_IntSize(vCnfs) );
            Vec_IntPush( vCnfs, nCubes );
            for ( k = 0; k < nCubes; k++ )
                Vec_IntPush( vCnfs, pCnf[k] );
        }
        *pnVars += 1;
        *pnClas += Vec_IntEntry(&p->vCnfSizes, iFunc);
        *pnLits += Vec_IntEntry(vLits, iFunc);
    }
    Vec_IntFree( vLits );
    return vCnfs;
}